

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this)

{
  int iVar1;
  parse_state pVar2;
  char_type_conflict **in_RDI;
  char_type_conflict *local_input_end;
  basic_json_parser<wchar_t,_std::allocator<char>_> *this_00;
  
  this_00 = (basic_json_parser<wchar_t,_std::allocator<char>_> *)in_RDI[0xd];
  while( true ) {
    while( true ) {
      if ((basic_json_parser<wchar_t,_std::allocator<char>_> *)in_RDI[0xe] == this_00) {
        return;
      }
      if (*(char *)(in_RDI + 0xf) != '\x1c') break;
      in_RDI[8] = (char_type_conflict *)((long)in_RDI[8] + 1);
      if (*in_RDI[0xe] == 10) {
        in_RDI[0xe] = in_RDI[0xe] + 1;
        in_RDI[9] = (char_type_conflict *)((long)in_RDI[9] + 1);
        in_RDI[10] = in_RDI[9];
        pVar2 = pop_state(this);
        *(parse_state *)(in_RDI + 0xf) = pVar2;
      }
      else {
        in_RDI[10] = in_RDI[9];
        pVar2 = pop_state(this);
        *(parse_state *)(in_RDI + 0xf) = pVar2;
      }
    }
    iVar1 = *in_RDI[0xe];
    if (((1 < iVar1 - 9U) && (iVar1 != 0xd)) && (iVar1 != 0x20)) break;
    skip_space(this_00,in_RDI);
  }
  return;
}

Assistant:

void skip_whitespace()
    {
        const char_type* local_input_end = end_input_;

        while (input_ptr_ != local_input_end) 
        {
            switch (state_)
            {
                case parse_state::cr:
                    ++line_;
                    //++position_;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            ++position_;
                            mark_position_ = position_;
                            state_ = pop_state();
                            break;
                        default:
                            mark_position_ = position_;
                            state_ = pop_state();
                            break;
                    }
                    break;

                default:
                    switch (*input_ptr_)
                    {
                        case ' ':case '\t':case '\n':case '\r':
                            skip_space(&input_ptr_);
                            break;
                        default:
                            return;
                    }
                    break;
            }
        }
    }